

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O1

void __thiscall
VectorSUnitTest_insert_multiple_elements_Test::~VectorSUnitTest_insert_multiple_elements_Test
          (VectorSUnitTest_insert_multiple_elements_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, insert_multiple_elements)
{
    vector_s<unsigned, 10> v{0u,1u,2u};
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());

    // Insert zero elements
    v.insert(v.begin(), 0, 10u);
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());

    // Insert 3 elements from start
    const auto it1 = v.insert(v.begin(), 3, 10u);
    EXPECT_EQ(10u, *it1);
    EXPECT_EQ(10u, *(it1 + 1));
    EXPECT_EQ(10u, *(it1 + 2));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(0u, v[3]);
    EXPECT_EQ(1u, v[4]);
    EXPECT_EQ(2u, v[5]);
    EXPECT_EQ(6u, v.size());

    // Insert 2 elements in the middle
    const auto it2 = v.insert(v.begin()+3, 2, 20u);
    EXPECT_EQ(20u, *it2);
    EXPECT_EQ(20u, *(it2 + 1));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(20u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(0u, v[5]);
    EXPECT_EQ(1u, v[6]);
    EXPECT_EQ(2u, v[7]);
    EXPECT_EQ(8u, v.size());

    // Insert 2 elements 'in' the end
    const auto it3 = v.insert(v.end(), 2, 50u);
    EXPECT_EQ(50u, *it3);
    EXPECT_EQ(50u, *(it3 + 1));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(20u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(0u, v[5]);
    EXPECT_EQ(1u, v[6]);
    EXPECT_EQ(2u, v[7]);
    EXPECT_EQ(50u, v[8]);
    EXPECT_EQ(50u, v[9]);
    EXPECT_EQ(10u, v.size());
}